

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCallIds_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this)

{
  DeferCommands *pDVar1;
  pointer pDVar2;
  ostream *poVar3;
  pointer pDVar4;
  pointer pDVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pDVar1 = (this->Defer)._M_t.
           super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
           .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (pDVar1 == (DeferCommands *)0x0) {
    return __return_storage_ptr__;
  }
  pDVar2 = *(pointer *)
            ((long)&(pDVar1->Commands).
                    super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
            + 8);
  for (pDVar4 = *(pointer *)
                 &(pDVar1->Commands).
                  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
      ; (pDVar4 != pDVar2 && ((pDVar4->Id)._M_string_length == 0)); pDVar4 = pDVar4 + 1) {
  }
  if (pDVar4 != pDVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pDVar4->Id)._M_dataplus._M_p,(pDVar4->Id)._M_string_length);
LAB_002a522d:
    pDVar5 = pDVar4;
    pDVar4 = pDVar5 + 1;
    if (pDVar4 != pDVar2) goto code_r0x002a5236;
    goto LAB_002a523d;
  }
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
LAB_002a52a3:
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
code_r0x002a5236:
  if (pDVar5[1].Id._M_string_length == 0) goto LAB_002a522d;
LAB_002a523d:
  if (pDVar4 != pDVar2) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(pDVar4->Id)._M_dataplus._M_p,pDVar5[1].Id._M_string_length);
    goto LAB_002a522d;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  goto LAB_002a52a3;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCallIds() const
{
  cm::optional<std::string> ids;
  if (this->Defer) {
    ids = cmJoin(
      cmMakeRange(this->Defer->Commands)
        .filter([](DeferCommand const& dc) -> bool { return !dc.Id.empty(); })
        .transform(
          [](DeferCommand const& dc) -> std::string const& { return dc.Id; }),
      ";");
  }
  return ids;
}